

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::BatchedBufferedData::Scan(BatchedBufferedData *this)

{
  pointer this_00;
  idx_t iVar1;
  long in_RSI;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_30;
  
  local_30._M_head_impl = (DataChunk *)0x0;
  ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x28))->__data);
  if (*(__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> **)
       (in_RSI + 0xc0) ==
      *(__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> **)
       (in_RSI + 0xa0)) {
    ::std::__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10));
    (this->super_BufferedData)._vptr_BufferedData = (_func_int **)0x0;
  }
  else {
    ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::operator=
              ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
               &local_30,
               *(__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> **)
                (in_RSI + 0xa0));
    ::std::
    deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ::pop_front((deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                 *)(in_RSI + 0x90));
    this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
              operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)&local_30);
    iVar1 = DataChunk::GetAllocationSize(this_00);
    LOCK();
    *(long *)(in_RSI + 0xe8) = *(long *)(in_RSI + 0xe8) - iVar1;
    UNLOCK();
    (this->super_BufferedData)._vptr_BufferedData = (_func_int **)local_30._M_head_impl;
    local_30._M_head_impl = (DataChunk *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x28));
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_30);
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> BatchedBufferedData::Scan() {
	unique_ptr<DataChunk> chunk;
	lock_guard<mutex> lock(glock);
	if (!read_queue.empty()) {
		chunk = std::move(read_queue.front());
		read_queue.pop_front();
		auto allocation_size = chunk->GetAllocationSize();
		read_queue_byte_count -= allocation_size;
	} else {
		context.reset();
		D_ASSERT(blocked_sinks.empty());
		D_ASSERT(buffer.empty());
		return nullptr;
	}
	return chunk;
}